

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

void Abc_NodeMffcLabel_rec(Abc_Obj_t *pNode,int fTopmost)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  int fTopmost_local;
  Abc_Obj_t *pNode_local;
  
  if (((fTopmost != 0) ||
      ((iVar1 = Abc_ObjIsCi(pNode), iVar1 == 0 && ((pNode->vFanouts).nSize < 1)))) &&
     (iVar1 = Abc_NodeIsTravIdCurrent(pNode), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pNode);
    for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_24 < iVar1; local_24 = local_24 + 1) {
      pNode_00 = Abc_ObjFanin(pNode,local_24);
      Abc_NodeMffcLabel_rec(pNode_00,0);
    }
  }
  return;
}

Assistant:

void Abc_NodeMffcLabel_rec( Abc_Obj_t * pNode, int fTopmost )
{
    Abc_Obj_t * pFanin;
    int i;
    // add to the new support nodes
    if ( !fTopmost && (Abc_ObjIsCi(pNode) || pNode->vFanouts.nSize > 0) )
        return;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // recur on the children
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NodeMffcLabel_rec( pFanin, 0 );
    // collect the internal node
//    printf( "%d ", pNode->Id );
}